

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O2

Location * __thiscall wabt::WastLexer::GetLocation(WastLexer *this)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  Location *in_RDI;
  uint uVar4;
  uint uVar6;
  undefined1 auVar5 [16];
  uint uVar7;
  uint uVar8;
  
  pcVar3 = (this->filename_)._M_dataplus._M_p;
  iVar2 = this->line_;
  pcVar1 = this->line_start_;
  (in_RDI->filename)._M_len = (this->filename_)._M_string_length;
  (in_RDI->filename)._M_str = pcVar3;
  (in_RDI->field_1).field_0.line = iVar2;
  auVar5._8_4_ = (int)pcVar1;
  auVar5._0_8_ = pcVar1;
  auVar5._12_4_ = (int)((ulong)pcVar1 >> 0x20);
  uVar4 = (int)((long)this->token_start_ - (long)pcVar1) + 1;
  uVar6 = (int)((long)this->cursor_ - auVar5._8_8_) + 1;
  uVar7 = -(uint)(1 < (int)uVar4);
  uVar8 = -(uint)(1 < (int)uVar6);
  (in_RDI->field_1).field_0.first_column = ~uVar7 & 1 | uVar4 & uVar7;
  (in_RDI->field_1).field_0.last_column = ~uVar8 & 1 | uVar6 & uVar8;
  return in_RDI;
}

Assistant:

Location WastLexer::GetLocation() {
  auto column = [this](const char* p) {
    return std::max(1, static_cast<int>(p - line_start_ + 1));
  };
  return Location(filename_, line_, column(token_start_), column(cursor_));
}